

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

LY_ERR lysp_resolve_import_include(lysp_ctx *pctx,lysp_module *pmod,ly_set *new_mods)

{
  LY_ERR LVar1;
  lysp_import *mod;
  ly_ctx *local_80;
  char *local_78;
  ly_ctx *local_60;
  ulong local_58;
  LY_ERR ret___1;
  LY_ERR ret__;
  uint64_t v;
  uint64_t u;
  lysp_import *imp;
  ly_set *new_mods_local;
  lysp_module *pmod_local;
  lysp_ctx *pctx_local;
  
  pmod->field_0x79 = pmod->field_0x79 & 0xfe | 1;
  v = 0;
  do {
    if (pmod->imports == (lysp_import *)0x0) {
      local_58 = 0;
    }
    else {
      local_58 = *(ulong *)(pmod->imports[-1].rev + 6);
    }
    if (local_58 <= v) {
      pctx_local._4_4_ = lysp_load_submodules(pctx,pmod,new_mods);
      if (pctx_local._4_4_ == LY_SUCCESS) {
        pmod->field_0x79 = pmod->field_0x79 & 0xfe;
        pctx_local._4_4_ = LY_SUCCESS;
      }
      return pctx_local._4_4_;
    }
    mod = pmod->imports + v;
    if (mod->module == (lys_module *)0x0) {
      if (pctx == (lysp_ctx *)0x0) {
        local_60 = (ly_ctx *)0x0;
      }
      else {
        local_60 = (ly_ctx *)
                   **(undefined8 **)
                     (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
      }
      if (mod->rev[0] == '\0') {
        local_78 = (char *)0x0;
      }
      else {
        local_78 = mod->rev;
      }
      LVar1 = lys_parse_load(local_60,mod->name,local_78,new_mods,&mod->module);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      if (mod->rev[0] == '\0') {
        mod->module->latest_revision = mod->module->latest_revision | 4;
      }
    }
    for (_ret___1 = 0; _ret___1 < v; _ret___1 = _ret___1 + 1) {
      if (mod->module == pmod->imports[_ret___1].module) {
        if (pctx == (lysp_ctx *)0x0) {
          local_80 = (ly_ctx *)0x0;
        }
        else {
          local_80 = (ly_ctx *)
                     **(undefined8 **)
                       (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
        }
        ly_log(local_80,LY_LLWRN,LY_SUCCESS,"Single revision of the module \"%s\" imported twice.",
               mod->name);
      }
    }
    v = v + 1;
  } while( true );
}

Assistant:

static LY_ERR
lysp_resolve_import_include(struct lysp_ctx *pctx, struct lysp_module *pmod, struct ly_set *new_mods)
{
    struct lysp_import *imp;
    LY_ARRAY_COUNT_TYPE u, v;

    pmod->parsing = 1;
    LY_ARRAY_FOR(pmod->imports, u) {
        imp = &pmod->imports[u];
        if (!imp->module) {
            LY_CHECK_RET(lys_parse_load(PARSER_CTX(pctx), imp->name, imp->rev[0] ? imp->rev : NULL, new_mods, &imp->module));

            if (!imp->rev[0]) {
                /* This module must be selected for the next similar
                 * import without revision-date to avoid incorrect
                 * derived identities in the ::lys_module.identities.
                 */
                imp->module->latest_revision |= LYS_MOD_IMPORTED_REV;
            }
        }
        /* check for importing the same module twice */
        for (v = 0; v < u; ++v) {
            if (imp->module == pmod->imports[v].module) {
                LOGWRN(PARSER_CTX(pctx), "Single revision of the module \"%s\" imported twice.", imp->name);
            }
        }
    }
    LY_CHECK_RET(lysp_load_submodules(pctx, pmod, new_mods));

    pmod->parsing = 0;

    return LY_SUCCESS;
}